

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndingWithTests.cpp
# Opt level: O1

void __thiscall
IsNotStringEndingWithTests::~IsNotStringEndingWithTests(IsNotStringEndingWithTests *this)

{
  ut11::TestFixture::~TestFixture(&this->super_TestFixture);
  operator_delete(this);
  return;
}

Assistant:

virtual void Run()
	{
		Then("string not EndingWith desired string is true", [&]() {
			AssertThat(ut11::Is::String::Not::EndingWith("Wor")("AvsdaWoroasdagf"), ut11::Is::True);
		});

		Then("string EndingWith desired string is false", [&]() {
			AssertThat(ut11::Is::String::Not::EndingWith("Wor")("ldWor"), ut11::Is::False);
		});

		Then("AssertThat using Not EndingWith works as expected", [&]() {
			AssertThat("Pianos and Pies", ut11::Is::String::Not::EndingWith("Piano"));
		});

		Then("Is::Not::String::EndingWith is an operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::String::Not::EndingWith("world")) >::value, ut11::Is::True);
		});

		Then("Is::Not::String::EndingWith has an error message", []() {
			AssertThat(ut11::Is::String::Not::EndingWith("world").GetErrorMessage("world"), ut11::Is::Not::EqualTo(""));
		});
	}